

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BifFileReader.cpp
# Opt level: O2

void __thiscall BifFileReader<NWN::ResRef16>::~BifFileReader(BifFileReader<NWN::ResRef16> *this)

{
  (this->super_IResourceAccessor<NWN::ResRef16>)._vptr_IResourceAccessor =
       (_func_int **)&PTR_OpenFile_001a0148;
  if ((FILE *)this->m_File != (FILE *)0x0) {
    fclose((FILE *)this->m_File);
    this->m_File = (HANDLE)0x0;
  }
  std::
  _Vector_base<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
  ::~_Vector_base(&(this->m_ResDir).
                   super__Vector_base<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
                 );
  std::__cxx11::string::~string((string *)&this->m_BifFileName);
  FileWrapper::~FileWrapper(&this->m_FileWrapper);
  return;
}

Assistant:

BifFileReader< ResRefT >::~BifFileReader(
	)
/*++

Routine Description:

	This routine cleans up an already-existing BifFileReader object.

Arguments:

	None.

Return Value:

	None.

Environment:

	User mode.

--*/
{
	if (m_File != nullptr)
	{

#if defined(_WINDOWS)
		CloseHandle( m_File );
#else
		fclose(m_File);
#endif
		m_File = nullptr;
	}
}